

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *__x;
  string *insertion_content;
  GeneratorContextImpl *pGVar1;
  size_type sVar2;
  ulong uVar3;
  bool bVar4;
  ostream *poVar5;
  reference ppVar6;
  ulong uVar7;
  long lVar8;
  Nullable<const_char_*> failure_msg;
  int iVar9;
  size_type sVar10;
  int iVar11;
  Arg *in_R8;
  string *insertion_offset;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  string *psVar13;
  string_view format;
  string *local_f0;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  it;
  string indent_;
  string *local_78 [2];
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pair;
  string magic_string;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0053ea78;
  std::
  __uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ::reset((__uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           *)&this->inner_,(pointer)0x0);
  pGVar1 = this->directory_;
  __x = &this->filename_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&indent_,__x,(char (*) [1])0x34bf6c);
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
  ::insert(&pair,(btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
                  *)&pGVar1->files_,(value_type *)&indent_);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&indent_);
  it.node_ = pair.first.node_;
  it.position_ = pair.first.position_;
  it._12_4_ = pair.first._12_4_;
  if ((this->insertion_point_)._M_string_length == 0) {
    if (pair.second != false) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&it);
      std::__cxx11::string::swap((string *)&ppVar6->second);
      goto LAB_001986de;
    }
    if (this->append_mode_ == true) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&it);
      std::__cxx11::string::append((string *)&ppVar6->second);
      goto LAB_001986de;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)__x);
    poVar5 = std::operator<<(poVar5,": Tried to write the same file twice.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    insertion_content = &this->data_;
    sVar2 = (this->data_)._M_string_length;
    if ((sVar2 != 0) && ((insertion_content->_M_dataplus)._M_p[sVar2 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)insertion_content);
    }
    if (pair.second == false) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&it);
      indent_._M_string_length = (size_type)(this->insertion_point_)._M_dataplus._M_p;
      indent_._M_dataplus._M_p = (pointer)(this->insertion_point_)._M_string_length;
      format._M_str = (char *)&indent_;
      format._M_len = (size_t)"@@protoc_insertion_point($0)";
      absl::lts_20250127::Substitute_abi_cxx11_(&magic_string,(lts_20250127 *)0x1c,format,in_R8);
      pbVar12 = &ppVar6->second;
      uVar7 = std::__cxx11::string::find((string *)pbVar12,(ulong)&magic_string);
      if (uVar7 == 0xffffffffffffffff) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)__x);
        poVar5 = std::operator<<(poVar5,": insertion point \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->insertion_point_);
        poVar5 = std::operator<<(poVar5,"\" not found.");
        std::endl<char,std::char_traits<char>>(poVar5);
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar7 < 4) {
LAB_00198491:
          lVar8 = std::__cxx11::string::rfind((char)pbVar12,10);
          insertion_offset = (string *)(lVar8 + 1);
        }
        else {
          insertion_offset = (string *)(uVar7 - 3);
          std::__cxx11::string::substr((ulong)&indent_,(ulong)pbVar12);
          bVar4 = std::operator==(&indent_,"/*");
          std::__cxx11::string::~string((string *)&indent_);
          if (!bVar4) goto LAB_00198491;
        }
        lVar8 = std::__cxx11::string::find_first_not_of((char *)pbVar12,0x34bf6a);
        std::__cxx11::string::string
                  ((string *)&indent_,(string *)pbVar12,(ulong)insertion_offset,
                   lVar8 - (long)insertion_offset);
        if (indent_._M_string_length == 0) {
          std::__cxx11::string::insert((ulong)pbVar12,insertion_offset);
          UpdateMetadata(this,insertion_content,(size_t)insertion_offset,
                         (this->data_)._M_string_length,0);
        }
        else {
          sVar2 = (this->data_)._M_string_length;
          iVar9 = 0;
          for (sVar10 = 0; sVar2 != sVar10; sVar10 = sVar10 + 1) {
            iVar11 = 0;
            if ((this->data_)._M_dataplus._M_p[sVar10] == '\n') {
              iVar11 = (int)indent_._M_string_length;
            }
            iVar9 = iVar9 + iVar11;
          }
          std::__cxx11::string::insert
                    ((ulong)pbVar12,(ulong)insertion_offset,(char)sVar2 + (char)iVar9);
          psVar13 = insertion_offset + (long)(pbVar12->_M_dataplus)._M_p;
          uVar7 = 0;
          while( true ) {
            uVar3 = (this->data_)._M_string_length;
            local_f0 = psVar13;
            if (uVar3 <= uVar7) break;
            memcpy(psVar13,indent_._M_dataplus._M_p,indent_._M_string_length);
            psVar13 = psVar13 + indent_._M_string_length;
            local_f0 = psVar13;
            lVar8 = std::__cxx11::string::find((char)insertion_content,10);
            __n = (lVar8 + 1U) - uVar7;
            memcpy(psVar13,(insertion_content->_M_dataplus)._M_p + uVar7,__n);
            psVar13 = psVar13 + __n;
            uVar7 = lVar8 + 1U;
          }
          local_78[0] = insertion_offset + (long)((pbVar12->_M_dataplus)._M_p + uVar3 + (long)iVar9)
          ;
          failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<char*,char*>
                                  ((char **)&local_f0,(char **)local_78,
                                   "target_ptr == &(*target)[pos] + data_.size() + indent_size");
          if (failure_msg != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x3ab,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_78);
          }
          UpdateMetadata(this,insertion_content,(size_t)insertion_offset,
                         (long)iVar9 + (this->data_)._M_string_length,indent_._M_string_length);
        }
        std::__cxx11::string::~string((string *)&indent_);
      }
      std::__cxx11::string::~string((string *)&magic_string);
      goto LAB_001986de;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)__x);
    poVar5 = std::operator<<(poVar5,": Tried to insert into file that doesn\'t exist.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  this->directory_->had_error_ = true;
LAB_001986de:
  GeneratedCodeInfo::~GeneratedCodeInfo(&this->info_to_insert_);
  std::
  unique_ptr<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ::~unique_ptr(&this->inner_);
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->insertion_point_);
  std::__cxx11::string::~string((string *)__x);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  auto pair = directory_->files_.insert({filename_, ""});
  auto it = pair.first;
  bool already_present = !pair.second;

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (already_present) {
      if (append_mode_) {
        it->second.append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    it->second.swap(data_);
    return;
  }
  // This was an OpenForInsert().

  // If the data doesn't end with a clean line break, add one.
  if (!data_.empty() && data_[data_.size() - 1] != '\n') {
    data_.push_back('\n');
  }

  // Find the file we are going to insert into.
  if (!already_present) {
    std::cerr << filename_ << ": Tried to insert into file that doesn't exist."
              << std::endl;
    directory_->had_error_ = true;
    return;
  }
  std::string* target = &it->second;

  // Find the insertion point.
  std::string magic_string =
      absl::Substitute("@@protoc_insertion_point($0)", insertion_point_);
  std::string::size_type pos = target->find(magic_string);

  if (pos == std::string::npos) {
    std::cerr << filename_ << ": insertion point \"" << insertion_point_
              << "\" not found." << std::endl;
    directory_->had_error_ = true;
    return;
  }

  if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
    // Support for inline "/* @@protoc_insertion_point() */"
    pos = pos - 3;
  } else {
    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the
    // insertion point down, so the data is inserted before it.  This is
    // intentional because it means that multiple insertions at the same point
    // will end up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == std::string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }
  }

  // Extract indent.
  std::string indent_(*target, pos,
                      target->find_first_not_of(" \t", pos) - pos);

  if (indent_.empty()) {
    // No indent.  This makes things easier.
    target->insert(pos, data_);
    UpdateMetadata(data_, pos, data_.size(), 0);
    return;
  }
  // Calculate how much space we need.
  int indent_size = 0;
  for (size_t i = 0; i < data_.size(); ++i) {
    if (data_[i] == '\n') indent_size += indent_.size();
  }

  // Make a hole for it.
  target->insert(pos, data_.size() + indent_size, '\0');

  // Now copy in the data.
  std::string::size_type data_pos = 0;
  char* target_ptr = &(*target)[pos];
  while (data_pos < data_.size()) {
    // Copy indent.
    memcpy(target_ptr, indent_.data(), indent_.size());
    target_ptr += indent_.size();

    // Copy line from data_.
    // We already guaranteed that data_ ends with a newline (above), so this
    // search can't fail.
    std::string::size_type line_length =
        data_.find_first_of('\n', data_pos) + 1 - data_pos;
    memcpy(target_ptr, data_.data() + data_pos, line_length);
    target_ptr += line_length;
    data_pos += line_length;
  }

  ABSL_CHECK_EQ(target_ptr, &(*target)[pos] + data_.size() + indent_size);

  UpdateMetadata(data_, pos, data_.size() + indent_size, indent_.size());
}